

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entry_iterator.cpp
# Opt level: O2

void __thiscall Pathie::entry_iterator::close_native_handle(entry_iterator *this)

{
  Path local_30;
  
  if ((DIR *)this->mp_cur != (DIR *)0x0) {
    closedir((DIR *)this->mp_cur);
    Path::Path(&local_30);
    Path::operator=(this->mp_cur_path,&local_30);
    std::__cxx11::string::_M_dispose();
    this->mp_cur = (void *)0x0;
  }
  return;
}

Assistant:

void entry_iterator::close_native_handle()
{
  if (!mp_cur)
    return;

#if defined(_PATHIE_UNIX)
  closedir(static_cast<DIR*>(mp_cur));
#elif defined(_WIN32)
  FindClose(static_cast<HANDLE>(mp_cur));
#endif

  // Reset member variables
  *mp_cur_path = Path();
  mp_cur = NULL;
}